

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

LONG PAL_ftell(PAL_FILE *f)

{
  long lVar1;
  undefined8 in_R9;
  long lRetVal;
  PAL_FILE *f_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (f == (PAL_FILE *)0x0) {
    fprintf(_stderr,"] %s %s:%d","PAL_ftell",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/file.cpp"
            ,0x2d9,in_R9,0);
    fprintf(_stderr,"Expression: f != NULL\n");
  }
  lVar1 = ftell((FILE *)f->bsdFilePtr);
  if (0x7fffffff < lVar1) {
    lVar1 = -1;
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return (LONG)lVar1;
}

Assistant:

LONG
_cdecl
PAL_ftell(PAL_FILE * f)
{
    long lRetVal = 0;

    PERF_ENTRY(ftell);
    ENTRY( "ftell( %p )\n", f );

    _ASSERTE(f != NULL);
    lRetVal = ftell( f->bsdFilePtr );

#ifdef BIT64
    /* Windows does not set an error if the file pointer's position
    is greater than _I32_MAX. It just returns -1. */
    if (lRetVal > _I32_MAX)
    {
        lRetVal = -1;
    }
#endif

    LOGEXIT( "ftell returning %ld\n", lRetVal );
    PERF_EXIT(ftell);
    /* This explicit cast to LONG is used to silence any potential warnings
    due to implicitly casting the native long lRetVal to LONG when returning. */
    return (LONG)lRetVal;
}